

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O3

int __thiscall gl3cts::TextureSizePromotion::Tests::init(Tests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *node;
  
  node = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)node,pCVar1->m_testCtx,"functional",
             "Verifies that texture internal format size promotion mechanism can be used.");
  node[1]._vptr_TestNode = (_func_int **)pCVar1;
  node->_vptr_TestNode = (_func_int **)&PTR__TestCase_020bf908;
  node[1].m_testCtx = (TestContext *)0x0;
  node[1].m_name._M_dataplus._M_p = (pointer)0x0;
  node[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,node);
  return extraout_EAX;
}

Assistant:

void Tests::init(void)
{
	addChild(new TextureSizePromotion::FunctionalTest(m_context));
}